

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

bool __thiscall doublechecked::Roaring::containsRange(Roaring *this,uint64_t x,uint64_t y)

{
  ulong uVar1;
  bool bVar2;
  const_iterator cVar3;
  int line;
  char *expression;
  unsigned_long result;
  ulong uVar4;
  _Rb_tree_header *p_Var5;
  key_type local_2c;
  
  bVar2 = roaring::Roaring::containsRange(&this->plain,x,y);
  local_2c = (key_type)x;
  cVar3 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::find(&(this->check)._M_t,&local_2c);
  if (x < y) {
    p_Var5 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar3._M_node == p_Var5) {
      result = (unsigned_long)!bVar2;
      expression = "ans == false";
      line = 0xb8;
    }
    else {
      uVar1 = x + 1;
      do {
        uVar4 = uVar1;
        cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
        if (((_Rb_tree_header *)cVar3._M_node == p_Var5) || (uVar4 != cVar3._M_node[1]._M_color))
        break;
        uVar1 = uVar4 + 1;
      } while (cVar3._M_node[1]._M_color < y);
      result = (unsigned_long)(bVar2 != (y != uVar4));
      expression = "ans == (last == y - 1)";
      line = 0xbd;
    }
  }
  else {
    result = (unsigned_long)bVar2;
    expression = "ans == true";
    line = 0xb6;
  }
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return bVar2;
}

Assistant:

bool containsRange(const uint64_t x, const uint64_t y) const {
        bool ans = plain.containsRange(x, y);

        auto it = check.find(x);
        if (x >= y)
            assert_true(ans == true);  // roaring says true for this
        else if (it == check.end())
            assert_true(ans == false);  // start of range not in set
        else {
            uint64_t last = x;  // iterate up to y so long as values sequential
            while (++it != check.end() && last + 1 == *it && *it < y)
                last = *it;
            assert_true(ans == (last == y - 1));
        }

        return ans;
    }